

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::SourceCodeInfo_Location::_InternalParse
          (SourceCodeInfo_Location *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  Arena *metadata;
  EpsCopyInputStream *in_RDX;
  char *in_RSI;
  SourceCodeInfo_Location *in_RDI;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  undefined4 in_stack_ffffffffffffffa8;
  int32 in_stack_ffffffffffffffac;
  SourceCodeInfo_Location *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  HasBits<1UL> in_stack_ffffffffffffffd4;
  char *local_20;
  
  memset(&stack0xffffffffffffffd4,0,4);
  metadata = GetArenaNoVirtual(in_stack_ffffffffffffffb0);
  local_20 = in_RSI;
LAB_005369d1:
  do {
    bVar1 = internal::ParseContext::Done
                      ((ParseContext *)in_stack_ffffffffffffffb0,
                       (char **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00536d35;
    local_20 = internal::ReadTag((char *)in_RDX,
                                 (uint32 *)
                                 CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                          in_stack_ffffffffffffffd0),
                                 (uint32)((ulong)metadata >> 0x20));
    if (local_20 == (char *)0x0) goto LAB_00536d52;
    in_stack_ffffffffffffffb0 =
         (SourceCodeInfo_Location *)(ulong)((in_stack_ffffffffffffffc4 >> 3) - 1);
    switch(in_stack_ffffffffffffffb0) {
    case (SourceCodeInfo_Location *)0x0:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 10) {
        _internal_mutable_path(in_RDI);
        local_20 = internal::PackedInt32Parser
                             (in_stack_ffffffffffffffb0,
                              (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              (ParseContext *)0x536a78);
      }
      else {
        if ((in_stack_ffffffffffffffc4 & 0xff) != 8) goto LAB_00536cd7;
        internal::ReadVarint((char **)in_stack_ffffffffffffffb0);
        _internal_add_path(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      }
      break;
    case (SourceCodeInfo_Location *)0x1:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x12) {
        _internal_mutable_span(in_RDI);
        local_20 = internal::PackedInt32Parser
                             (in_stack_ffffffffffffffb0,
                              (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              (ParseContext *)0x536b0e);
      }
      else {
        if ((in_stack_ffffffffffffffc4 & 0xff) != 0x10) goto LAB_00536cd7;
        internal::ReadVarint((char **)in_stack_ffffffffffffffb0);
        _internal_add_span(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      }
      break;
    case (SourceCodeInfo_Location *)0x2:
      if ((in_stack_ffffffffffffffc4 & 0xff) != 0x1a) goto LAB_00536cd7;
      _internal_mutable_leading_comments_abi_cxx11_
                ((SourceCodeInfo_Location *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      local_20 = internal::InlineGreedyStringParserUTF8Verify
                           ((string *)
                            CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                     in_stack_ffffffffffffffd0),(char *)metadata,
                            (ParseContext *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (char *)in_RDI);
      break;
    case (SourceCodeInfo_Location *)0x3:
      if ((in_stack_ffffffffffffffc4 & 0xff) != 0x22) goto LAB_00536cd7;
      _internal_mutable_trailing_comments_abi_cxx11_
                ((SourceCodeInfo_Location *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      local_20 = internal::InlineGreedyStringParserUTF8Verify
                           ((string *)
                            CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                     in_stack_ffffffffffffffd0),(char *)metadata,
                            (ParseContext *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (char *)in_RDI);
      break;
    default:
      goto LAB_00536cd7;
    case (SourceCodeInfo_Location *)0x5:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x32) {
        do {
          _internal_add_leading_detached_comments_abi_cxx11_((SourceCodeInfo_Location *)0x536c73);
          local_20 = internal::InlineGreedyStringParserUTF8Verify
                               ((string *)
                                CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                         in_stack_ffffffffffffffd0),(char *)metadata,
                                (ParseContext *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                (char *)in_RDI);
          if (local_20 == (char *)0x0) goto LAB_00536d52;
          bVar1 = internal::EpsCopyInputStream::DataAvailable(in_RDX,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<50u>(local_20), bVar1));
        goto LAB_005369d1;
      }
LAB_00536cd7:
      if (((in_stack_ffffffffffffffc4 & 7) == 4) || (in_stack_ffffffffffffffc4 == 0)) {
        internal::EpsCopyInputStream::SetLastTag(in_RDX,in_stack_ffffffffffffffc4);
        goto LAB_00536d35;
      }
      local_20 = internal::UnknownFieldParse
                           ((uint32)in_stack_ffffffffffffffd4.has_bits_[0],
                            (InternalMetadataWithArena *)metadata,
                            (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (ParseContext *)in_RDI);
    }
    if (local_20 == (char *)0x0) {
LAB_00536d52:
      local_20 = (char *)0x0;
LAB_00536d35:
      internal::HasBits<1UL>::Or(&in_RDI->_has_bits_,(HasBits<1UL> *)&stack0xffffffffffffffd4);
      return local_20;
    }
  } while( true );
}

Assistant:

const char* SourceCodeInfo_Location::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated int32 path = 1 [packed = true];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_path(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8) {
          _internal_add_path(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated int32 span = 2 [packed = true];
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_span(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16) {
          _internal_add_span(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string leading_comments = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_leading_comments(), ptr, ctx, "google.protobuf.SourceCodeInfo.Location.leading_comments");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string trailing_comments = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_trailing_comments(), ptr, ctx, "google.protobuf.SourceCodeInfo.Location.trailing_comments");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string leading_detached_comments = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_leading_detached_comments(), ptr, ctx, "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}